

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  bool bVar1;
  cmMakefile *this_00;
  cmLinkImplItem *this_01;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  cmLocalGenerator *pcVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  PolicyStatus PVar9;
  iterator iVar10;
  string *psVar11;
  cmValue __args;
  ostream *poVar12;
  string *psVar13;
  cmake *this_02;
  cmLinkImplementationLibraries *pcVar14;
  string *psVar15;
  PolicyID id;
  PolicyID id_00;
  pointer this_03;
  pointer pEVar16;
  MessageType MVar17;
  __ireturn_type _Var18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view value;
  allocator<char> local_3a9;
  string propertyName;
  string fwInclude;
  EvaluatedTargetPropertyEntries entries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  cmList debugProperties;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string obj_dir;
  bool local_220;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  ConfigAndLanguage cacheKey;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&cacheKey,config,lang);
  iVar10 = std::
           _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&(this->IncludeDirectoriesCache)._M_t,&cacheKey);
  if ((_Rb_tree_header *)iVar10._M_node ==
      &(this->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
    uniqueIncludes._M_h._M_bucket_count = 1;
    uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueIncludes._M_h._M_element_count = 0;
    uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"INCLUDE_DIRECTORIES",(allocator<char> *)&obj_dir);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_2e0,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_2e0);
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&propertyName,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&fwInclude
              );
    psVar11 = (string *)cmMakefile::GetDefinition(this_00,&propertyName);
    if (psVar11 == (string *)0x0) {
      psVar11 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&obj_dir,(string *)psVar11);
    init._M_len = 1;
    init._M_array = &obj_dir;
    cmList::cmList(&debugProperties,init);
    std::__cxx11::string::~string((string *)&obj_dir);
    std::__cxx11::string::~string((string *)&propertyName);
    if (this->DebugIncludesDone == false) {
      bVar8 = ::cm::contains<cmList,_char[20],_0>(&debugProperties,(char (*) [20])0x6b0423);
    }
    else {
      bVar8 = false;
    }
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugIncludesDone = true;
    }
    EvaluateTargetPropertyEntries
              (&entries,this,config,lang,&dagChecker,&this->IncludeDirectoriesEntries);
    bVar6 = std::operator==(lang,"Swift");
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&obj_dir,"Swift_MODULE_DIRECTORY",(allocator<char> *)&propertyName);
      anon_unknown.dwarf_11b6006::AddLangSpecificImplicitIncludeDirectories
                (this,lang,config,&obj_dir,BINARY,&entries);
      std::__cxx11::string::~string((string *)&obj_dir);
    }
    bVar6 = CanCompileSources(this);
    if (bVar6) {
      bVar6 = std::operator!=(lang,"Swift");
      if (bVar6) {
        bVar6 = std::operator!=(lang,"Fortran");
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&propertyName,"ISPC_HEADER_DIRECTORY",(allocator<char> *)&obj_dir);
          GetAllConfigCompileLanguages_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&obj_dir,this);
          bVar6 = ::cm::
                  contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&obj_dir,(char (*) [5])"ISPC");
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&obj_dir);
          if (bVar6) {
            __args = GetProperty(this,&propertyName);
            if (__args.Value == (string *)0x0) {
              (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x18])
                        (&obj_dir,this->GlobalGenerator,&this->ObjectDirectory,config);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,&obj_dir);
              std::__cxx11::string::~string((string *)&obj_dir);
            }
            else {
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,__args.Value);
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&obj_dir,"ISPC",(allocator<char> *)&fwInclude);
          anon_unknown.dwarf_11b6006::AddLangSpecificImplicitIncludeDirectories
                    (this,&obj_dir,config,&propertyName,OBJECT,&entries);
          std::__cxx11::string::~string((string *)&obj_dir);
          std::__cxx11::string::~string((string *)&propertyName);
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_dir,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&propertyName);
    AddInterfaceEntries(this,config,&obj_dir,lang,&dagChecker,&entries,Yes,Usage);
    std::__cxx11::string::~string((string *)&obj_dir);
    for (pEVar16 = entries.Entries.
                   super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pEVar16 !=
        entries.Entries.
        super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish; pEVar16 = pEVar16 + 1) {
      this_01 = pEVar16->LinkImplItem;
      psVar11 = cmLinkItem::AsStr_abi_cxx11_(&this_01->super_cmLinkItem);
      pcVar2 = (this_01->super_cmLinkItem).Target;
      if (pcVar2 == (cmGeneratorTarget *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = IsImported(pcVar2);
      }
      bVar1 = this_01->CheckCMP0027;
      propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
      propertyName._M_string_length = 0;
      propertyName.field_2._M_local_buf[0] = '\0';
      psVar3 = (pEVar16->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar15 = (pEVar16->Values).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3;
          psVar15 = psVar15 + 1) {
        if (bVar6 != false) {
          bVar7 = cmsys::SystemTools::FileExists(psVar15);
          if (bVar7) goto LAB_0037525b;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
          MVar17 = FATAL_ERROR;
          if (bVar1 != false) {
            PVar9 = GetPolicyStatusCMP0027(this);
            if (PVar9 != OLD) {
              if (PVar9 != WARN) goto LAB_003755cc;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&fwInclude,(cmPolicies *)0x1b,id_00);
              poVar12 = std::operator<<((ostream *)&obj_dir,(string *)&fwInclude);
              std::operator<<(poVar12,"\n");
              std::__cxx11::string::~string((string *)&fwInclude);
            }
            MVar17 = AUTHOR_WARNING;
          }
LAB_003755cc:
          poVar12 = std::operator<<((ostream *)&obj_dir,"Imported target \"");
          poVar12 = std::operator<<(poVar12,(string *)psVar11);
          poVar12 = std::operator<<(poVar12,"\" includes non-existent path\n  \"");
          poVar12 = std::operator<<(poVar12,(string *)psVar15);
          std::operator<<(poVar12,
                          "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                         );
          pcVar4 = this->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar4,MVar17,&fwInclude);
          std::__cxx11::string::~string((string *)&fwInclude);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
LAB_00375667:
          std::__cxx11::string::~string((string *)&propertyName);
          goto LAB_00375671;
        }
LAB_0037525b:
        bVar7 = cmsys::SystemTools::FileIsFullPath(psVar15);
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
          if (psVar11->_M_string_length == 0) {
            PVar9 = GetPolicyStatusCMP0021(this);
            if (PVar9 == OLD) {
              bVar7 = true;
              MVar17 = FATAL_ERROR;
            }
            else if (PVar9 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&fwInclude,(cmPolicies *)0x15,id);
              poVar12 = std::operator<<((ostream *)&obj_dir,(string *)&fwInclude);
              std::operator<<(poVar12,"\n");
              std::__cxx11::string::~string((string *)&fwInclude);
              MVar17 = AUTHOR_WARNING;
              bVar7 = false;
            }
            else {
              bVar7 = false;
              MVar17 = FATAL_ERROR;
            }
            poVar12 = std::operator<<((ostream *)&obj_dir,
                                      "Found relative path while evaluating include directories of \""
                                     );
            psVar13 = GetName_abi_cxx11_(this);
            poVar12 = std::operator<<(poVar12,(string *)psVar13);
            poVar12 = std::operator<<(poVar12,"\":\n  \"");
            poVar12 = std::operator<<(poVar12,(string *)psVar15);
            std::operator<<(poVar12,"\"\n");
            if (!bVar7) goto LAB_0037538f;
          }
          else {
            poVar12 = std::operator<<((ostream *)&obj_dir,"Target \"");
            poVar12 = std::operator<<(poVar12,(string *)psVar11);
            poVar12 = std::operator<<(poVar12,
                                      "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                     );
            poVar12 = std::operator<<(poVar12,(string *)psVar15);
            std::operator<<(poVar12,"\"");
            MVar17 = FATAL_ERROR;
LAB_0037538f:
            pcVar4 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar4,MVar17,&fwInclude);
            std::__cxx11::string::~string((string *)&fwInclude);
            if (MVar17 == FATAL_ERROR) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
              goto LAB_00375667;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
        }
        value._M_str = (psVar15->_M_dataplus)._M_p;
        value._M_len = psVar15->_M_string_length;
        bVar7 = cmValue::IsOff(value);
        if (!bVar7) {
          cmsys::SystemTools::ConvertToUnixSlashes(psVar15);
        }
        _Var18 = std::__detail::
                 _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&uniqueIncludes,psVar15);
        if (((undefined1  [16])_Var18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,psVar15,&pEVar16->Backtrace);
          if (bVar8 != false) {
            std::operator+(&fwInclude," * ",psVar15);
            std::operator+(&obj_dir,&fwInclude,"\n");
            std::__cxx11::string::append((string *)&propertyName);
            std::__cxx11::string::~string((string *)&obj_dir);
            std::__cxx11::string::~string((string *)&fwInclude);
          }
        }
      }
      if (propertyName._M_string_length != 0) {
        this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"Used includes for target ",&local_3a9);
        psVar11 = GetName_abi_cxx11_(this);
        std::operator+(&local_318,&local_2c0,psVar11);
        std::operator+(&fwInclude,&local_318,":\n");
        std::operator+(&obj_dir,&fwInclude,&propertyName);
        cmake::IssueMessage(this_02,LOG,&obj_dir,&pEVar16->Backtrace);
        std::__cxx11::string::~string((string *)&obj_dir);
        std::__cxx11::string::~string((string *)&fwInclude);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2c0);
      }
      std::__cxx11::string::~string((string *)&propertyName);
    }
LAB_00375671:
    bVar8 = IsApple(this);
    if (bVar8) {
      pcVar14 = GetLinkImplementationLibraries(this,config,Usage);
      if (pcVar14 != (cmLinkImplementationLibraries *)0x0) {
        pcVar5 = (pcVar14->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (this_03 = (pcVar14->Libraries).
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                       super__Vector_impl_data._M_start; this_03 != pcVar5; this_03 = this_03 + 1) {
          propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
          propertyName._M_string_length = 0;
          propertyName.field_2._M_local_buf[0] = '\0';
          pcVar2 = (this_03->super_cmLinkItem).Target;
          if (pcVar2 == (cmGeneratorTarget *)0x0) {
            psVar11 = cmLinkItem::AsStr_abi_cxx11_(&this_03->super_cmLinkItem);
            psVar15 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
            cmsys::SystemTools::CollapseFullPath(&obj_dir,psVar11,psVar15);
            std::__cxx11::string::operator=((string *)&propertyName,(string *)&obj_dir);
            std::__cxx11::string::~string((string *)&obj_dir);
LAB_00375757:
            cmGlobalGenerator::SplitFrameworkPath
                      ((optional<cmGlobalGenerator::FrameworkDescriptor> *)&obj_dir,
                       this->LocalGenerator->GlobalGenerator,&propertyName,Relaxed);
            if (local_220 != false) {
              cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
                        (&fwInclude,(FrameworkDescriptor *)&obj_dir);
              _Var18 = std::__detail::
                       _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&uniqueIncludes,&fwInclude);
              if (((undefined1  [16])_Var18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_318._M_dataplus._M_p = (pointer)0x0;
                local_318._M_string_length = 0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_318);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)__return_storage_ptr__,&fwInclude,(cmListFileBacktrace *)&local_318);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_318._M_string_length
                          );
              }
              std::__cxx11::string::~string((string *)&fwInclude);
            }
            std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_reset
                      ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)&obj_dir);
          }
          else {
            bVar8 = cmTarget::IsFrameworkOnApple(pcVar2->Target);
            if (bVar8) {
LAB_003756fe:
              GetLocation((this_03->super_cmLinkItem).Target,config);
              std::__cxx11::string::_M_assign((string *)&propertyName);
              goto LAB_00375757;
            }
            bVar8 = IsImportedFrameworkFolderOnApple(this,config);
            if (bVar8) goto LAB_003756fe;
          }
          std::__cxx11::string::~string((string *)&propertyName);
        }
      }
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                *)&this->IncludeDirectoriesCache,&cacheKey,__return_storage_ptr__);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&entries.Entries);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties.Values);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueIncludes._M_h);
  }
  else {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(iVar10._M_node + 3));
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&cacheKey);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  ConfigAndLanguage cacheKey(config, lang);
  {
    auto it = this->IncludeDirectoriesCache.find(cacheKey);
    if (it != this->IncludeDirectoriesCache.end()) {
      return it->second;
    }
  }
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  if (this->IsApple()) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir;
        if (lib.Target == nullptr) {
          libDir = cmSystemTools::CollapseFullPath(
            lib.AsStr(), this->Makefile->GetHomeOutputDirectory());
        } else if (lib.Target->Target->IsFrameworkOnApple() ||
                   this->IsImportedFrameworkFolderOnApple(config)) {
          libDir = lib.Target->GetLocation(config);
        } else {
          continue;
        }

        auto fwDescriptor =
          this->GetGlobalGenerator()->SplitFrameworkPath(libDir);
        if (!fwDescriptor) {
          continue;
        }

        auto fwInclude = fwDescriptor->GetFrameworkPath();
        if (uniqueIncludes.insert(fwInclude).second) {
          includes.emplace_back(fwInclude, cmListFileBacktrace());
        }
      }
    }
  }

  this->IncludeDirectoriesCache.emplace(cacheKey, includes);
  return includes;
}